

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaLiteTest_Swap_Test::TestBody
          (Proto3ArenaLiteTest_Swap_Test *this)

{
  TestAllTypes *this_00;
  TestAllTypes *other;
  char *pcVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_190;
  AssertHelper local_188;
  AssertionResult gtest_ar;
  Arena arena2;
  Arena arena1;
  
  internal::ThreadSafeArena::ThreadSafeArena(&arena1.impl_);
  internal::ThreadSafeArena::ThreadSafeArena(&arena2.impl_);
  this_00 = (TestAllTypes *)Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes>(&arena1);
  other = (TestAllTypes *)Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes>(&arena2);
  proto3_arena_unittest::TestAllTypes::Swap(this_00,other);
  local_188.data_ =
       (AssertHelperData *)(this_00->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_188.data_ & 1) != 0) {
    local_188.data_ = *(AssertHelperData **)((ulong)local_188.data_ & 0xfffffffffffffffe);
  }
  local_190._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena1;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&gtest_ar,"&arena1","arena1_message->GetArena()",(Arena **)&local_190,
             (Arena **)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_lite_unittest.cc"
               ,0x68,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_188.data_ =
       (AssertHelperData *)(other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)local_188.data_ & 1) != 0) {
    local_188.data_ = *(AssertHelperData **)((ulong)local_188.data_ & 0xfffffffffffffffe);
  }
  local_190._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena2;
  testing::internal::CmpHelperEQ<google::protobuf::Arena*,google::protobuf::Arena*>
            ((internal *)&gtest_ar,"&arena2","arena2_message->GetArena()",(Arena **)&local_190,
             (Arena **)&local_188);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/proto3_arena_lite_unittest.cc"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if (local_190._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_190._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena2.impl_);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena1.impl_);
  return;
}

Assistant:

TEST(Proto3ArenaLiteTest, Swap) {
  Arena arena1;
  Arena arena2;

  // Test Swap().
  TestAllTypes* arena1_message = Arena::Create<TestAllTypes>(&arena1);
  TestAllTypes* arena2_message = Arena::Create<TestAllTypes>(&arena2);
  arena1_message->Swap(arena2_message);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
}